

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastMultiplier3(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int Entry;
  uint uVar4;
  Vec_Wec_t *vProds;
  Vec_Wec_t *vLevels;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint local_a8;
  uint local_a4;
  Vec_Int_t *local_a0;
  ulong local_88;
  
  local_a8 = nArgB + nArgA;
  vProds = (Vec_Wec_t *)malloc(0x10);
  local_a4 = 8;
  if (6 < (nArgB + nArgA) - 1U) {
    local_a4 = local_a8;
  }
  vProds->nCap = local_a4;
  if (local_a4 == 0) {
    local_a0 = (Vec_Int_t *)0x0;
  }
  else {
    local_a0 = (Vec_Int_t *)calloc((long)(int)local_a4,0x10);
  }
  vProds->pArray = local_a0;
  vProds->nSize = local_a8;
  vLevels = (Vec_Wec_t *)malloc(0x10);
  vLevels->nCap = local_a4;
  if (local_a4 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)(int)local_a4,0x10);
  }
  vLevels->pArray = pVVar5;
  vLevels->nSize = local_a8;
  if (0 < nArgA) {
    iVar2 = 1;
    lVar10 = 0;
    local_88 = 0;
    do {
      if (0 < nArgB) {
        uVar7 = 0;
        lVar9 = lVar10;
        do {
          Entry = Gia_ManHashAnd(pNew,pArgA[local_88],pArgB[uVar7]);
          iVar1 = (int)uVar7;
          iVar6 = (int)local_88 + iVar1;
          if ((int)local_a8 <= iVar6) {
            uVar4 = local_a8 * 2;
            local_a8 = iVar2 + iVar1;
            if ((int)uVar4 <= (int)local_a8) {
              uVar4 = local_a8;
            }
            if (uVar4 - local_a4 != 0 && (int)local_a4 <= (int)uVar4) {
              if (local_a0 == (Vec_Int_t *)0x0) {
                local_a0 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                local_a0 = (Vec_Int_t *)realloc(local_a0,(ulong)uVar4 << 4);
              }
              vProds->pArray = local_a0;
              memset(local_a0 + (int)local_a4,0,(long)(int)(uVar4 - local_a4) << 4);
              vProds->nCap = uVar4;
              local_a4 = uVar4;
            }
            vProds->nSize = local_a8;
          }
          if ((int)local_a8 <= iVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush((Vec_Int_t *)((long)&local_a0->nCap + lVar9),Entry);
          if (vLevels->nSize <= iVar6) {
            uVar4 = vLevels->nSize * 2;
            uVar8 = iVar2 + iVar1;
            if ((int)uVar4 <= (int)uVar8) {
              uVar4 = uVar8;
            }
            iVar1 = vLevels->nCap;
            if (iVar1 < (int)uVar4) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar4 << 4);
              }
              vLevels->pArray = pVVar5;
              memset(pVVar5 + iVar1,0,(long)(int)(uVar4 - iVar1) << 4);
              vLevels->nCap = uVar4;
            }
            vLevels->nSize = uVar8;
          }
          pVVar5 = vLevels->pArray;
          Vec_IntPush((Vec_Int_t *)((long)&pVVar5->nCap + lVar9),0);
          uVar7 = uVar7 + 1;
          lVar9 = lVar9 + 0x10;
        } while ((uint)nArgB != uVar7);
      }
      local_88 = local_88 + 1;
      iVar2 = iVar2 + 1;
      lVar10 = lVar10 + 0x10;
    } while (local_88 != (uint)nArgA);
  }
  Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes);
  if ((int)local_a4 < 1) {
    if (local_a0 != (Vec_Int_t *)0x0) goto LAB_00306237;
  }
  else {
    lVar10 = 0;
    do {
      pvVar3 = *(void **)((long)&local_a0->pArray + lVar10);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&local_a0->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)local_a4 << 4 != lVar10);
LAB_00306237:
    free(local_a0);
    pVVar5 = vLevels->pArray;
  }
  free(vProds);
  iVar2 = vLevels->nCap;
  if ((long)iVar2 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0030628d;
  }
  else {
    lVar10 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar5->pArray + lVar10);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar5->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar10);
  }
  free(pVVar5);
LAB_0030628d:
  free(vLevels);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            Vec_WecPush( vProds,  i+k, Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]) );
            Vec_WecPush( vLevels, i+k, 0 );
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}